

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::AddNode(CConnman *this,AddedNodeParams *add)

{
  pointer pAVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  bool bVar2;
  __type_conflict _Var3;
  bool bVar4;
  uint16_t uVar5;
  pointer __rhs;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock87;
  CService resolved;
  undefined8 in_stack_ffffffffffffff08;
  _Manager_type in_stack_ffffffffffffff18;
  vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *this_00;
  _Invoker_type in_stack_ffffffffffffff20;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_d8;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_b8;
  unique_lock<std::mutex> local_98;
  CService local_88;
  CService local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = GetDefaultPort(this,&add->m_added_node);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&local_b8,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = add;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_ffffffffffffff08;
  dns_lookup_function.super__Function_base._M_manager = in_stack_ffffffffffffff18;
  dns_lookup_function._M_invoker = in_stack_ffffffffffffff20;
  LookupNumeric(&local_60,&add->m_added_node,uVar5,dns_lookup_function);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  bVar2 = CNetAddr::IsValid(&local_60.super_CNetAddr);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_98,&this->m_added_nodes_mutex,
             "m_added_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xdcc,false);
  this_00 = &this->m_added_node_params;
  pAVar1 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__rhs = (this->m_added_node_params).
               super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
               super__Vector_impl_data._M_start; __rhs != pAVar1; __rhs = __rhs + 1) {
    _Var3 = std::operator==(&add->m_added_node,&__rhs->m_added_node);
    if (!_Var3 && bVar2) {
      uVar5 = GetDefaultPort(this,&__rhs->m_added_node);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function(&local_d8,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function_00.super__Function_base._M_functor._8_8_ = add;
      dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
           (void *)in_stack_ffffffffffffff08;
      dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)this_00;
      dns_lookup_function_00._M_invoker = (_Invoker_type)this;
      LookupNumeric(&local_88,&__rhs->m_added_node,uVar5,dns_lookup_function_00);
      bVar4 = ::operator==(&local_60,&local_88);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88);
      std::_Function_base::~_Function_base(&local_d8.super__Function_base);
      if (bVar4) goto LAB_007156d3;
    }
    else if (_Var3) goto LAB_007156d3;
  }
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::push_back(this_00,add);
LAB_007156d3:
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __rhs == pAVar1;
}

Assistant:

bool CConnman::AddNode(const AddedNodeParams& add)
{
    const CService resolved(LookupNumeric(add.m_added_node, GetDefaultPort(add.m_added_node)));
    const bool resolved_is_valid{resolved.IsValid()};

    LOCK(m_added_nodes_mutex);
    for (const auto& it : m_added_node_params) {
        if (add.m_added_node == it.m_added_node || (resolved_is_valid && resolved == LookupNumeric(it.m_added_node, GetDefaultPort(it.m_added_node)))) return false;
    }

    m_added_node_params.push_back(add);
    return true;
}